

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

void __thiscall
iffl::
flat_forward_list<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>,_std::allocator<_FILE_FULL_EA_INFORMATION>_>
::commit_new_buffer(flat_forward_list<_FILE_FULL_EA_INFORMATION,_iffl::flat_forward_list_traits<_FILE_FULL_EA_INFORMATION>,_std::allocator<_FILE_FULL_EA_INFORMATION>_>
                    *this,char **buffer,size_t *buffer_size)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  
  pcVar1 = (this->buffer_).v2_.begin;
  pcVar2 = (this->buffer_).v2_.end;
  if (pcVar1 <= pcVar2) {
    pcVar3 = *buffer;
    sVar4 = *buffer_size;
    if ((sVar4 == 0 || pcVar3 != (char *)0x0) && (pcVar3 == (char *)0x0 || sVar4 != 0)) {
      (this->buffer_).v2_.begin = pcVar3;
      (this->buffer_).v2_.end = pcVar3 + sVar4;
      *buffer = pcVar1;
      *buffer_size = (long)pcVar2 - (long)pcVar1;
      return;
    }
  }
  std::terminate();
}

Assistant:

void commit_new_buffer(char *&buffer, size_t &buffer_size) noexcept {
        char *old_begin = buff().begin;
        FFL_CODDING_ERROR_IF(buff().end < buff().begin);
        size_type old_size = buff().end - buff().begin;
        FFL_CODDING_ERROR_IF(buffer == nullptr && buffer_size != 0);
        FFL_CODDING_ERROR_IF(buffer != nullptr && buffer_size == 0);
        buff().begin = buffer;
        buff().end = buff().begin + buffer_size;
        buffer = old_begin;
        buffer_size = old_size;
    }